

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission_parse.cpp
# Opt level: O3

bool __thiscall FIntermissionActionCast::ParseKey(FIntermissionActionCast *this,FScanner *sc)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *copyStr;
  FString *this_00;
  FCastSound *pFVar4;
  
  bVar1 = FScanner::Compare(sc,"CastName");
  if (bVar1) {
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x102);
    copyStr = sc->String;
    this_00 = &this->mName;
  }
  else {
    bVar1 = FScanner::Compare(sc,"CastClass");
    if (bVar1) {
      FScanner::MustGetToken(sc,0x3d);
      FScanner::MustGetToken(sc,0x102);
      iVar2 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
      (this->mCastClass).Index = iVar2;
      return true;
    }
    bVar1 = FScanner::Compare(sc,"AttackSound");
    if (!bVar1) {
      bVar1 = FIntermissionAction::ParseKey(&this->super_FIntermissionAction,sc);
      return bVar1;
    }
    uVar3 = TArray<FCastSound,_FCastSound>::Reserve(&this->mCastSounds,1);
    pFVar4 = (this->mCastSounds).Array;
    FScanner::MustGetToken(sc,0x3d);
    FScanner::MustGetToken(sc,0x102);
    iVar2 = FScanner::MatchString(sc,ParseKey::seqs,8);
    pFVar4 = pFVar4 + uVar3;
    this_00 = &pFVar4->mSound;
    pFVar4->mSequence = (BYTE)iVar2;
    FScanner::MustGetToken(sc,0x2c);
    FScanner::MustGetToken(sc,0x104);
    pFVar4->mIndex = (BYTE)sc->Number;
    FScanner::MustGetToken(sc,0x2c);
    FScanner::MustGetToken(sc,0x102);
    copyStr = sc->String;
  }
  FString::operator=(this_00,copyStr);
  return true;
}

Assistant:

bool FIntermissionActionCast::ParseKey(FScanner &sc)
{
	if (sc.Compare("CastName"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		mName = sc.String;
		return true;
	}
	else if (sc.Compare("CastClass"))
	{
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		mCastClass = sc.String;
		return true;
	}
	else if (sc.Compare("AttackSound"))
	{
		static const char *const seqs[] = {"Missile", "Melee", NULL};
		FCastSound *cs = &mCastSounds[mCastSounds.Reserve(1)];
		sc.MustGetToken('=');
		sc.MustGetToken(TK_StringConst);
		cs->mSequence = (BYTE)sc.MatchString(seqs);
		sc.MustGetToken(',');
		sc.MustGetToken(TK_IntConst);
		cs->mIndex = (BYTE)sc.Number;
		sc.MustGetToken(',');
		sc.MustGetToken(TK_StringConst);
		cs->mSound = sc.String;
		return true;
	}
	else return Super::ParseKey(sc);
}